

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deblock.c
# Opt level: O1

void com_deblock_set_edge(com_core_t *core)

{
  com_map_t *map;
  com_ref_pic_t (*refp) [2];
  short sVar1;
  short sVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  com_seqh_t *pcVar7;
  s8 *psVar8;
  u8 *puVar9;
  s8 (*pasVar10) [2];
  s8 (*pasVar11) [2];
  s16 (*paasVar12) [2] [2];
  ushort uVar13;
  long lVar14;
  int scu_x;
  int scu_y;
  byte *pbVar15;
  ushort uVar16;
  com_pic_t *pcVar17;
  long lVar18;
  int iVar19;
  com_pic_t *pcVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  byte bVar26;
  com_pic_t *pcVar27;
  long lVar28;
  com_pic_t *pcVar29;
  int cuw;
  int cuh;
  int in_stack_ffffffffffffff78;
  com_pic_t *local_68;
  com_pic_t *local_58;
  
  pcVar7 = core->seqhdr;
  psVar8 = (core->map).map_patch;
  iVar19 = pcVar7->i_scu;
  lVar18 = (long)iVar19;
  lVar14 = (long)core->cu_scup;
  lVar28 = (long)core->lcu_x + (long)pcVar7->pic_width_in_lcu * (long)core->lcu_y;
  uVar3 = core->cu_width;
  cuw = (int)uVar3 >> 2;
  uVar4 = core->cu_height;
  cuh = (int)uVar4 >> 2;
  uVar5 = core->cu_pix_x;
  scu_x = (int)uVar5 >> 2;
  uVar6 = core->cu_pix_y;
  scu_y = (int)uVar6 >> 2;
  iVar24 = (int)uVar4 >> 0x1f;
  iVar23 = (int)uVar3 >> 0x1f;
  if (((byte)(core->map).map_scu[lVar14] & 0x12) != 0) {
    puVar9 = (core->map).map_edge;
    iVar22 = core->tb_part;
    if (iVar22 == 5) {
      uVar21 = (cuh - iVar24 >> 1) + scu_y;
      if (3 < uVar3 && (uVar21 & 1) == 0) {
        lVar25 = 0;
        do {
          puVar9[lVar25 + (int)(uVar21 * iVar19 + scu_x)] =
               puVar9[lVar25 + (int)(uVar21 * iVar19 + scu_x)] | 4;
          lVar25 = lVar25 + 1;
        } while (cuw != (int)lVar25);
      }
      uVar21 = scu_x + (cuw - iVar23 >> 1);
      if (3 < uVar4 && (uVar21 & 1) == 0) {
        pbVar15 = puVar9 + (int)(scu_y * iVar19 + uVar21);
        iVar19 = cuh;
        do {
          *pbVar15 = *pbVar15 | 1;
          pbVar15 = pbVar15 + lVar18;
          iVar19 = iVar19 + -1;
        } while (iVar19 != 0);
      }
    }
    else if (iVar22 == 7) {
      iVar24 = cuw + 3;
      if (-1 < cuw) {
        iVar24 = cuw;
      }
      uVar21 = scu_x + (iVar24 >> 2);
      if (3 < uVar4 && (uVar21 & 1) == 0) {
        pbVar15 = puVar9 + (int)(scu_y * iVar19 + uVar21);
        iVar22 = cuh;
        do {
          *pbVar15 = *pbVar15 | 1;
          pbVar15 = pbVar15 + lVar18;
          iVar22 = iVar22 + -1;
        } while (iVar22 != 0);
      }
      uVar21 = (cuw - iVar23 >> 1) + scu_x;
      if (3 < uVar4 && (uVar21 & 1) == 0) {
        pbVar15 = puVar9 + (int)(scu_y * iVar19 + uVar21);
        iVar23 = cuh;
        do {
          *pbVar15 = *pbVar15 | 1;
          pbVar15 = pbVar15 + lVar18;
          iVar23 = iVar23 + -1;
        } while (iVar23 != 0);
      }
      uVar21 = scu_x + (iVar24 >> 2) * 3;
      if (3 < uVar4 && (uVar21 & 1) == 0) {
        pbVar15 = puVar9 + (int)(scu_y * iVar19 + uVar21);
        iVar19 = cuh;
        do {
          *pbVar15 = *pbVar15 | 1;
          pbVar15 = pbVar15 + lVar18;
          iVar19 = iVar19 + -1;
        } while (iVar19 != 0);
      }
    }
    else if (iVar22 == 6) {
      iVar23 = cuh + 3;
      if (-1 < cuh) {
        iVar23 = cuh;
      }
      uVar21 = scu_y + (iVar23 >> 2);
      if (3 < uVar3 && (uVar21 & 1) == 0) {
        lVar25 = 0;
        do {
          puVar9[lVar25 + (int)(uVar21 * iVar19 + scu_x)] =
               puVar9[lVar25 + (int)(uVar21 * iVar19 + scu_x)] | 4;
          lVar25 = lVar25 + 1;
        } while (cuw != (int)lVar25);
      }
      uVar21 = (cuh - iVar24 >> 1) + scu_y;
      if (3 < uVar3 && (uVar21 & 1) == 0) {
        lVar25 = 0;
        do {
          puVar9[lVar25 + (int)(uVar21 * iVar19 + scu_x)] =
               puVar9[lVar25 + (int)(uVar21 * iVar19 + scu_x)] | 4;
          lVar25 = lVar25 + 1;
        } while (cuw != (int)lVar25);
      }
      uVar21 = scu_y + (iVar23 >> 2) * 3;
      if (3 < uVar3 && (uVar21 & 1) == 0) {
        lVar25 = 0;
        do {
          puVar9[lVar25 + (int)(uVar21 * iVar19 + scu_x)] =
               puVar9[lVar25 + (int)(uVar21 * iVar19 + scu_x)] | 4;
          lVar25 = lVar25 + 1;
        } while (cuw != (int)lVar25);
      }
    }
    if ((char)((uVar6 & 4) >> 2) == '\0' && 3 < uVar6) {
      if ((core->cu_pix_y == core->lcu_pix_y) && (pcVar7->cross_patch_loop_filter == '\0')) {
        if (uVar3 < 4 ||
            psVar8[lVar28] != psVar8[(long)(int)lVar28 - (long)pcVar7->pic_width_in_lcu])
        goto LAB_001130da;
      }
      else if (uVar3 < 4) goto LAB_001130da;
      lVar25 = 0;
      do {
        puVar9[lVar25 + lVar14] = puVar9[lVar25 + lVar14] | 0xc;
        lVar25 = lVar25 + 1;
      } while (cuw != (int)lVar25);
    }
LAB_001130da:
    if ((char)((uVar5 & 4) >> 2) != '\0' || uVar5 < 4) {
      return;
    }
    if ((core->cu_pix_x == core->lcu_pix_x) && (pcVar7->cross_patch_loop_filter == '\0')) {
      if (uVar4 < 4 || psVar8[lVar28] != psVar8[lVar28 + -1]) {
        return;
      }
    }
    else if (uVar4 < 4) {
      return;
    }
    pbVar15 = puVar9 + lVar14;
    do {
      *pbVar15 = *pbVar15 | 3;
      pbVar15 = pbVar15 + lVar18;
      cuh = cuh + -1;
    } while (cuh != 0);
    return;
  }
  map = &core->map;
  refp = core->refp;
  iVar22 = core->tb_part;
  if (iVar22 == 5) {
    uVar21 = (cuh - iVar24 >> 1) + scu_y;
    if ((uVar21 & 1) == 0) {
      com_df_set_edge_hor(map,iVar19,refp,scu_x,uVar21,cuw,in_stack_ffffffffffffff78);
    }
    iVar24 = cuw - iVar23 >> 1;
  }
  else {
    if (iVar22 != 7) {
      if (iVar22 == 6) {
        iVar23 = cuh + 3;
        if (-1 < cuh) {
          iVar23 = cuh;
        }
        uVar21 = scu_y + (iVar23 >> 2);
        if ((uVar21 & 1) == 0) {
          com_df_set_edge_hor(map,iVar19,refp,scu_x,uVar21,cuw,in_stack_ffffffffffffff78);
        }
        uVar21 = (cuh - iVar24 >> 1) + scu_y;
        if ((uVar21 & 1) == 0) {
          com_df_set_edge_hor(map,iVar19,refp,scu_x,uVar21,cuw,in_stack_ffffffffffffff78);
        }
        uVar21 = (iVar23 >> 2) * 3 + scu_y;
        if ((uVar21 & 1) == 0) {
          com_df_set_edge_hor(map,iVar19,refp,scu_x,uVar21,cuw,in_stack_ffffffffffffff78);
        }
      }
      goto LAB_00113212;
    }
    iVar24 = cuw + 3;
    if (-1 < cuw) {
      iVar24 = cuw;
    }
    uVar21 = scu_x + (iVar24 >> 2);
    if ((uVar21 & 1) == 0) {
      com_df_set_edge_ver(map,iVar19,refp,uVar21,scu_y,cuh,in_stack_ffffffffffffff78);
    }
    uVar21 = (cuw - iVar23 >> 1) + scu_x;
    if ((uVar21 & 1) == 0) {
      com_df_set_edge_ver(map,iVar19,refp,uVar21,scu_y,cuh,in_stack_ffffffffffffff78);
    }
    iVar24 = (iVar24 >> 2) * 3;
  }
  if ((iVar24 + scu_x & 1U) == 0) {
    com_df_set_edge_ver(map,iVar19,refp,iVar24 + scu_x,scu_y,cuh,in_stack_ffffffffffffff78);
  }
LAB_00113212:
  if (((char)((uVar6 & 4) >> 2) == '\0' && 3 < uVar6) &&
     (((core->cu_pix_y != core->lcu_pix_y || (pcVar7->cross_patch_loop_filter != '\0')) ||
      (psVar8[lVar28] == psVar8[(long)(int)lVar28 - (long)pcVar7->pic_width_in_lcu])))) {
    pasVar10 = (core->map).map_refi;
    lVar14 = (long)(scu_y * iVar19 + scu_x);
    if ((long)pasVar10[lVar14][0] < 0) {
      local_68 = (com_pic_t *)0x0;
    }
    else {
      local_68 = refp[pasVar10[lVar14][0]][0].pic;
    }
    if ((long)pasVar10[lVar14][1] < 0) {
      local_58 = (com_pic_t *)0x0;
    }
    else {
      local_58 = core->refp[pasVar10[lVar14][1]][1].pic;
    }
    if (3 < uVar3) {
      puVar9 = (core->map).map_edge;
      iVar24 = (scu_y + -1) * iVar19 + scu_x;
      lVar25 = lVar14;
      do {
        bVar26 = 0xc;
        if (((byte)(core->map).map_scu[iVar24] & 0x12) == 0) {
          pasVar11 = (core->map).map_refi;
          if (pasVar10[lVar14] == pasVar11[iVar24]) {
            paasVar12 = (core->map).map_mv;
            if (pasVar10[lVar14][0] < '\0') {
LAB_00113400:
              if (pasVar10[lVar14][1] < '\0') {
LAB_0011351a:
                bVar26 = 0;
              }
              else {
                iVar23 = (int)paasVar12[lVar25][1][0] - (int)paasVar12[iVar24][1][0];
                uVar13 = (ushort)iVar23;
                uVar16 = -uVar13;
                if (0 < iVar23) {
                  uVar16 = uVar13;
                }
                if (uVar16 < 4) {
                  sVar1 = paasVar12[lVar25][1][1];
                  sVar2 = paasVar12[iVar24][1][1];
LAB_00113507:
                  uVar13 = (ushort)((int)sVar1 - (int)sVar2);
                  uVar16 = -uVar13;
                  if (0 < (int)sVar1 - (int)sVar2) {
                    uVar16 = uVar13;
                  }
                  if (uVar16 < 4) goto LAB_0011351a;
                }
              }
            }
            else {
              iVar23 = (int)paasVar12[lVar25][0][0] - (int)paasVar12[iVar24][0][0];
              uVar13 = (ushort)iVar23;
              uVar16 = -uVar13;
              if (0 < iVar23) {
                uVar16 = uVar13;
              }
              if (uVar16 < 4) {
                iVar23 = (int)paasVar12[lVar25][0][1] - (int)paasVar12[iVar24][0][1];
                uVar13 = (ushort)iVar23;
                uVar16 = -uVar13;
                if (0 < iVar23) {
                  uVar16 = uVar13;
                }
                if (uVar16 < 4) goto LAB_00113400;
              }
            }
          }
          else {
            if ((long)pasVar11[iVar24][0] < 0) {
              pcVar17 = (com_pic_t *)0x0;
            }
            else {
              pcVar17 = refp[pasVar11[iVar24][0]][0].pic;
            }
            if ((long)pasVar11[iVar24][1] < 0) {
              pcVar20 = (com_pic_t *)0x0;
            }
            else {
              pcVar20 = core->refp[pasVar11[iVar24][1]][1].pic;
            }
            if ((pcVar20 == local_68) && (pcVar17 == local_58)) {
              paasVar12 = (core->map).map_mv;
              if (pasVar10[lVar14][0] < '\0') {
LAB_001134d5:
                if (-1 < pasVar10[lVar14][1]) {
                  iVar23 = (int)paasVar12[lVar25][1][0] - (int)paasVar12[iVar24][0][0];
                  uVar13 = (ushort)iVar23;
                  uVar16 = -uVar13;
                  if (0 < iVar23) {
                    uVar16 = uVar13;
                  }
                  if (3 < uVar16) goto LAB_00113393;
                  sVar1 = paasVar12[lVar25][1][1];
                  sVar2 = paasVar12[iVar24][0][1];
                  goto LAB_00113507;
                }
                goto LAB_0011351a;
              }
              iVar23 = (int)paasVar12[lVar25][0][0] - (int)paasVar12[iVar24][1][0];
              uVar13 = (ushort)iVar23;
              uVar16 = -uVar13;
              if (0 < iVar23) {
                uVar16 = uVar13;
              }
              if (uVar16 < 4) {
                iVar23 = (int)paasVar12[lVar25][0][1] - (int)paasVar12[iVar24][1][1];
                uVar13 = (ushort)iVar23;
                uVar16 = -uVar13;
                if (0 < iVar23) {
                  uVar16 = uVar13;
                }
                if (uVar16 < 4) goto LAB_001134d5;
              }
            }
          }
        }
LAB_00113393:
        pbVar15 = puVar9 + lVar25;
        *pbVar15 = *pbVar15 | bVar26;
        cuw = cuw + -1;
        iVar24 = iVar24 + 1;
        lVar25 = lVar25 + 1;
      } while (cuw != 0);
    }
  }
  if (((char)((uVar5 & 4) >> 2) == '\0' && 3 < uVar5) &&
     (((core->cu_pix_x != core->lcu_pix_x || (pcVar7->cross_patch_loop_filter != '\0')) ||
      (psVar8[lVar28] == psVar8[lVar28 + -1])))) {
    pasVar10 = (core->map).map_refi;
    lVar14 = (long)(scu_y * iVar19 + scu_x);
    if ((long)pasVar10[lVar14][0] < 0) {
      pcVar17 = (com_pic_t *)0x0;
    }
    else {
      pcVar17 = refp[pasVar10[lVar14][0]][0].pic;
    }
    if ((long)pasVar10[lVar14][1] < 0) {
      pcVar20 = (com_pic_t *)0x0;
    }
    else {
      pcVar20 = core->refp[pasVar10[lVar14][1]][1].pic;
    }
    if (3 < uVar4) {
      puVar9 = (core->map).map_edge;
      lVar28 = lVar14;
      do {
        bVar26 = 3;
        if (((byte)(core->map).map_scu[lVar28 + -1] & 0x12) == 0) {
          pasVar11 = (core->map).map_refi;
          if (pasVar10[lVar14] == pasVar11[lVar28 + -1]) {
            paasVar12 = (core->map).map_mv;
            if (pasVar10[lVar14][0] < '\0') {
LAB_001135da:
              if (pasVar10[lVar14][1] < '\0') {
LAB_00113702:
                bVar26 = 0;
              }
              else {
                iVar19 = (int)paasVar12[lVar28][1][0] - (int)paasVar12[lVar28 + -1][1][0];
                uVar13 = (ushort)iVar19;
                uVar16 = -uVar13;
                if (0 < iVar19) {
                  uVar16 = uVar13;
                }
                if (uVar16 < 4) {
                  sVar1 = paasVar12[lVar28][1][1];
                  sVar2 = paasVar12[lVar28 + -1][1][1];
LAB_001136ea:
                  uVar13 = (ushort)((int)sVar1 - (int)sVar2);
                  uVar16 = -uVar13;
                  if (0 < (int)sVar1 - (int)sVar2) {
                    uVar16 = uVar13;
                  }
                  if (uVar16 < 4) goto LAB_00113702;
                }
              }
            }
            else {
              iVar19 = (int)paasVar12[lVar28][0][0] - (int)paasVar12[lVar28 + -1][0][0];
              uVar13 = (ushort)iVar19;
              uVar16 = -uVar13;
              if (0 < iVar19) {
                uVar16 = uVar13;
              }
              if (uVar16 < 4) {
                iVar19 = (int)paasVar12[lVar28][0][1] - (int)paasVar12[lVar28 + -1][0][1];
                uVar13 = (ushort)iVar19;
                uVar16 = -uVar13;
                if (0 < iVar19) {
                  uVar16 = uVar13;
                }
                if (uVar16 < 4) goto LAB_001135da;
              }
            }
          }
          else {
            if ((long)pasVar11[lVar28 + -1][0] < 0) {
              pcVar27 = (com_pic_t *)0x0;
            }
            else {
              pcVar27 = refp[pasVar11[lVar28 + -1][0]][0].pic;
            }
            if ((long)pasVar11[lVar28 + -1][1] < 0) {
              pcVar29 = (com_pic_t *)0x0;
            }
            else {
              pcVar29 = core->refp[pasVar11[lVar28 + -1][1]][1].pic;
            }
            if ((pcVar29 == pcVar17) && (pcVar27 == pcVar20)) {
              paasVar12 = (core->map).map_mv;
              if (pasVar10[lVar14][0] < '\0') {
LAB_001136b5:
                if (-1 < pasVar10[lVar14][1]) {
                  iVar19 = (int)paasVar12[lVar28][1][0] - (int)paasVar12[lVar28 + -1][0][0];
                  uVar13 = (ushort)iVar19;
                  uVar16 = -uVar13;
                  if (0 < iVar19) {
                    uVar16 = uVar13;
                  }
                  if (3 < uVar16) goto LAB_00113566;
                  sVar1 = paasVar12[lVar28][1][1];
                  sVar2 = paasVar12[lVar28 + -1][0][1];
                  goto LAB_001136ea;
                }
                goto LAB_00113702;
              }
              iVar19 = (int)paasVar12[lVar28][0][0] - (int)paasVar12[lVar28 + -1][1][0];
              uVar13 = (ushort)iVar19;
              uVar16 = -uVar13;
              if (0 < iVar19) {
                uVar16 = uVar13;
              }
              if (uVar16 < 4) {
                iVar19 = (int)paasVar12[lVar28][0][1] - (int)paasVar12[lVar28 + -1][1][1];
                uVar13 = (ushort)iVar19;
                uVar16 = -uVar13;
                if (0 < iVar19) {
                  uVar16 = uVar13;
                }
                if (uVar16 < 4) goto LAB_001136b5;
              }
            }
          }
        }
LAB_00113566:
        pbVar15 = puVar9 + lVar28;
        *pbVar15 = *pbVar15 | bVar26;
        cuh = cuh + -1;
        lVar28 = lVar28 + lVar18;
      } while (cuh != 0);
    }
  }
  return;
}

Assistant:

void com_deblock_set_edge(com_core_t *core)
{
    com_seqh_t *seqhdr = core->seqhdr;
    com_map_t *map = &core->map;
    s8 *patch_idx = map->map_patch;
    int i_scu = seqhdr->i_scu;
    int scup = core->cu_scup;
    int lcu_idx = core->lcu_y * seqhdr->pic_width_in_lcu + core->lcu_x;
    int scu_w = core->cu_width  >> MIN_CU_LOG2;
    int scu_h = core->cu_height >> MIN_CU_LOG2;
    int scu_x = core->cu_pix_x  >> MIN_CU_LOG2;
    int scu_y = core->cu_pix_y  >> MIN_CU_LOG2;
    const int grad_mask = (LOOPFILTER_GRID >> 2) - 1;
    const com_scu_t mask = { 0, 1, 0, 0, 1, 0, 0 };
    com_scu_t scu = map->map_scu[scup];

    if ((*(u8*)&scu) & (*(u8*)&mask)) {
        u8 *edge = map->map_edge;

        switch (core->tb_part) {
        case SIZE_2NxhN:
            com_df_set_edge_hor_force(edge, i_scu, scu_x, scu_y + scu_h / 4 * 1, scu_w, EDGE_TYPE_LUMA);
            com_df_set_edge_hor_force(edge, i_scu, scu_x, scu_y + scu_h / 2    , scu_w, EDGE_TYPE_LUMA);
            com_df_set_edge_hor_force(edge, i_scu, scu_x, scu_y + scu_h / 4 * 3, scu_w, EDGE_TYPE_LUMA);
            break;                    
        case SIZE_hNx2N:              
            com_df_set_edge_ver_force(edge, i_scu, scu_x + scu_w / 4 * 1, scu_y, scu_h, EDGE_TYPE_LUMA);
            com_df_set_edge_ver_force(edge, i_scu, scu_x + scu_w / 2    , scu_y, scu_h, EDGE_TYPE_LUMA);
            com_df_set_edge_ver_force(edge, i_scu, scu_x + scu_w / 4 * 3, scu_y, scu_h, EDGE_TYPE_LUMA);
            break;                    
        case SIZE_NxN:                
            com_df_set_edge_hor_force(edge, i_scu, scu_x, scu_y + scu_h / 2, scu_w, EDGE_TYPE_LUMA);
            com_df_set_edge_ver_force(edge, i_scu, scu_x + scu_w / 2, scu_y, scu_h, EDGE_TYPE_LUMA);
            break;
        default:
            break;
        }
        if (scu_y && (scu_y & grad_mask) == 0 && (core->cu_pix_y != core->lcu_pix_y || seqhdr->cross_patch_loop_filter || patch_idx[lcu_idx] == patch_idx[lcu_idx - seqhdr->pic_width_in_lcu])) {
            com_df_set_edge_hor_force_cu(edge + scup, i_scu, scu_w, EDGE_TYPE_ALL);  // UP
        }
        if (scu_x && (scu_x & grad_mask) == 0 && (core->cu_pix_x != core->lcu_pix_x || seqhdr->cross_patch_loop_filter || patch_idx[lcu_idx] == patch_idx[lcu_idx - 1])) {
            com_df_set_edge_ver_force_cu(edge + scup, i_scu, scu_h, EDGE_TYPE_ALL);  // LEFT
        }

    } else {
        com_ref_pic_t(*refp)[REFP_NUM] = core->refp;

#define set_edge_hor(map, i_scu, refp, scu_x, scu_y, cu_w, flag) { if (((scu_y) & grad_mask) == 0)  com_df_set_edge_hor(map, i_scu, refp, scu_x, scu_y, cu_w, flag); }
#define set_edge_ver(map, i_scu, refp, scu_x, scu_y, cu_w, flag) { if (((scu_x) & grad_mask) == 0)  com_df_set_edge_ver(map, i_scu, refp, scu_x, scu_y, cu_w, flag); }
        
        switch (core->tb_part) {
        case SIZE_2NxhN:
            set_edge_hor(map, i_scu, refp, scu_x, scu_y + scu_h / 4 * 1, scu_w, EDGE_TYPE_LUMA);
            set_edge_hor(map, i_scu, refp, scu_x, scu_y + scu_h / 2    , scu_w, EDGE_TYPE_LUMA);
            set_edge_hor(map, i_scu, refp, scu_x, scu_y + scu_h / 4 * 3, scu_w, EDGE_TYPE_LUMA);
            break;
        case SIZE_hNx2N:
            set_edge_ver(map, i_scu, refp, scu_x + scu_w / 4 * 1, scu_y, scu_h, EDGE_TYPE_LUMA);
            set_edge_ver(map, i_scu, refp, scu_x + scu_w / 2    , scu_y, scu_h, EDGE_TYPE_LUMA);
            set_edge_ver(map, i_scu, refp, scu_x + scu_w / 4 * 3, scu_y, scu_h, EDGE_TYPE_LUMA);
            break;
        case SIZE_NxN:
            set_edge_hor(map, i_scu, refp, scu_x, scu_y + scu_h / 2, scu_w, EDGE_TYPE_LUMA);
            set_edge_ver(map, i_scu, refp, scu_x + scu_w / 2, scu_y, scu_h, EDGE_TYPE_LUMA);
            break;
        default:
            break;
        }
        
        if (scu_y && (scu_y & grad_mask) == 0 && (core->cu_pix_y != core->lcu_pix_y || seqhdr->cross_patch_loop_filter || patch_idx[lcu_idx] == patch_idx[lcu_idx - seqhdr->pic_width_in_lcu])) {
            com_df_set_edge_hor_inline(map, i_scu, refp, scu_x, scu_y, scu_w, EDGE_TYPE_ALL);  // UP
        }
        if (scu_x && (scu_x & grad_mask) == 0 && (core->cu_pix_x != core->lcu_pix_x || seqhdr->cross_patch_loop_filter || patch_idx[lcu_idx] == patch_idx[lcu_idx - 1])) {
            com_df_set_edge_ver_inline(map, i_scu, refp, scu_x, scu_y, scu_h, EDGE_TYPE_ALL);  // LEFT
        }
    }
}